

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdi::ControlLabel::updateWindowIcon(ControlLabel *this)

{
  long lVar1;
  char cVar2;
  QStyle *pQVar3;
  long in_FS_OFFSET;
  double dVar4;
  undefined4 local_50;
  undefined4 local_4c;
  QSize local_48 [3];
  QIcon menuIcon;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  menuIcon.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QWidget::windowIcon((QWidget *)&menuIcon);
  cVar2 = QIcon::isNull();
  if (cVar2 != '\0') {
    pQVar3 = QWidget::style(&this->super_QWidget);
    (**(code **)(*(long *)pQVar3 + 0x100))
              (local_48,pQVar3,0,0,*(undefined8 *)(*(long *)&(this->super_QWidget).field_0x8 + 0x10)
              );
    QIcon::operator=(&menuIcon,(QIcon *)local_48);
    QIcon::~QIcon((QIcon *)local_48);
  }
  pQVar3 = QWidget::style(&this->super_QWidget);
  local_50 = (**(code **)(*(long *)pQVar3 + 0xe0))
                       (pQVar3,0x5b,0,
                        *(undefined8 *)(*(long *)&(this->super_QWidget).field_0x8 + 0x10));
  local_4c = local_50;
  dVar4 = (double)QPaintDevice::devicePixelRatio();
  QIcon::pixmap(local_48,dVar4,(Mode)&menuIcon,(State)&local_50);
  QPixmap::operator=(&this->label,(QPixmap *)local_48);
  QPixmap::~QPixmap((QPixmap *)local_48);
  QWidget::update(&this->super_QWidget);
  QIcon::~QIcon(&menuIcon);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ControlLabel::updateWindowIcon()
{
    QIcon menuIcon = windowIcon();
    if (menuIcon.isNull())
        menuIcon = style()->standardIcon(QStyle::SP_TitleBarMenuButton, nullptr, parentWidget());
    const int iconSize = style()->pixelMetric(QStyle::PM_TitleBarButtonIconSize, nullptr, parentWidget());
    label = menuIcon.pixmap(QSize(iconSize, iconSize), devicePixelRatio());
    update();
}